

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

bool __thiscall cmGhsMultiTargetGenerator::DetermineIfIntegrityApp(cmGhsMultiTargetGenerator *this)

{
  cmGeneratorTarget *this_00;
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  cmValue cVar5;
  string *psVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar7;
  _Alloc_hider _Var8;
  long lVar9;
  pointer pcVar10;
  string_view value;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_58;
  
  this_00 = this->GeneratorTarget;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ghs_integrity_app","");
  cVar5 = cmGeneratorTarget::GetProperty(this_00,&local_58);
  pcVar7 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    pcVar7 = extraout_RDX_00;
  }
  if (cVar5.Value != (string *)0x0) {
    value._M_str = pcVar7;
    value._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value);
    return bVar3;
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  cmGeneratorTarget::GetSourceFiles
            (this->GeneratorTarget,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_58,&this->ConfigName)
  ;
  sVar1 = local_58._M_string_length;
  lVar9 = (long)(local_58._M_string_length - (long)local_58._M_dataplus._M_p) >> 5;
  _Var8._M_p = local_58._M_dataplus._M_p;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    pcVar2 = local_58._M_dataplus._M_p + 0x10;
    do {
      pcVar10 = pcVar2;
      psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)(pcVar10 + -0x10));
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -0x10;
        goto LAB_0031f61a;
      }
      psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)(pcVar10 + -8));
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -8;
        goto LAB_0031f61a;
      }
      psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)pcVar10);
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar4 == 0) goto LAB_0031f61a;
      psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)(pcVar10 + 8));
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + 8;
        goto LAB_0031f61a;
      }
      lVar9 = lVar9 + -1;
      pcVar2 = pcVar10 + 0x20;
    } while (1 < lVar9);
    _Var8._M_p = pcVar10 + 0x10;
  }
  lVar9 = (long)(sVar1 - (long)_Var8._M_p) >> 3;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pcVar10 = (pointer)sVar1;
      if (lVar9 != 3) goto LAB_0031f61a;
      psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var8._M_p);
      iVar4 = std::__cxx11::string::compare((char *)psVar6);
      pcVar10 = _Var8._M_p;
      if (iVar4 == 0) goto LAB_0031f61a;
      _Var8._M_p = _Var8._M_p + 8;
    }
    psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var8._M_p);
    iVar4 = std::__cxx11::string::compare((char *)psVar6);
    pcVar10 = _Var8._M_p;
    if (iVar4 == 0) goto LAB_0031f61a;
    _Var8._M_p = _Var8._M_p + 8;
  }
  psVar6 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var8._M_p);
  iVar4 = std::__cxx11::string::compare((char *)psVar6);
  pcVar10 = _Var8._M_p;
  if (iVar4 != 0) {
    pcVar10 = (pointer)sVar1;
  }
LAB_0031f61a:
  if (local_58._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
  }
  return pcVar10 != (pointer)sVar1;
}

Assistant:

bool cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()
{
  if (cmValue p = this->GeneratorTarget->GetProperty("ghs_integrity_app")) {
    return p.IsOn();
  }
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);
  return std::any_of(sources.begin(), sources.end(),
                     [](cmSourceFile const* sf) -> bool {
                       return "int" == sf->GetExtension();
                     });
}